

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml.cpp
# Opt level: O0

int __thiscall TiXmlElement::QueryUnsignedAttribute(TiXmlElement *this,char *name,uint *value)

{
  int local_34;
  int result;
  int ival;
  TiXmlAttribute *node;
  uint *value_local;
  char *name_local;
  TiXmlElement *this_local;
  
  node = (TiXmlAttribute *)value;
  value_local = (uint *)name;
  name_local = (char *)this;
  _result = TiXmlAttributeSet::Find(&this->attributeSet,name);
  if (_result == (TiXmlAttribute *)0x0) {
    this_local._4_4_ = 1;
  }
  else {
    local_34 = 0;
    this_local._4_4_ = TiXmlAttribute::QueryIntValue(_result,&local_34);
    *(int *)&(node->super_TiXmlBase)._vptr_TiXmlBase = local_34;
  }
  return this_local._4_4_;
}

Assistant:

int TiXmlElement::QueryUnsignedAttribute( const char* name, unsigned* value ) const
{
	const TiXmlAttribute* node = attributeSet.Find( name );
	if ( !node )
		return TIXML_NO_ATTRIBUTE;

	int ival = 0;
	int result = node->QueryIntValue( &ival );
	*value = (unsigned)ival;
	return result;
}